

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

parser * init_parse_themed(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  z_info->themed_max = 0;
  parser_reg(p,"name str name",parse_themed_name);
  parser_reg(p,"message str message",parse_themed_message);
  parser_reg(p,"D str text",parse_themed_d);
  return p;
}

Assistant:

static struct parser *init_parse_themed(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	z_info->themed_max = 0;
	parser_reg(p, "name str name", parse_themed_name);
	parser_reg(p, "message str message", parse_themed_message);
	parser_reg(p, "D str text", parse_themed_d);
	return p;
}